

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool Catch::Internal::
     Evaluator<bsim::quad_value_bit_vector,_bsim::quad_value_bit_vector,_(Catch::Internal::Operator)0>
     ::evaluate(quad_value_bit_vector *lhs,quad_value_bit_vector *rhs)

{
  uchar uVar1;
  uchar uVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar3 = lhs->N;
  if (rhs->N == uVar3) {
    bVar5 = (int)uVar3 < 1;
    if (0 < (int)uVar3) {
      bVar5 = false;
      uVar4 = 1;
      do {
        uVar1 = (lhs->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar4 - 1].value;
        if (uVar1 == '\x03') {
          __assert_fail("!a.is_high_impedance()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0x109,"bool bsim::operator!=(const quad_value &, const quad_value &)");
        }
        uVar2 = (rhs->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar4 - 1].value;
        if (uVar2 == '\x03') {
          __assert_fail("!b.is_high_impedance()",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                        ,0x10a,"bool bsim::operator!=(const quad_value &, const quad_value &)");
        }
        if (uVar1 == '\x02') {
          return bVar5;
        }
        if (uVar1 != uVar2) {
          return bVar5;
        }
        bVar5 = uVar3 <= uVar4;
        bVar6 = uVar4 != uVar3;
        uVar4 = uVar4 + 1;
      } while (bVar6);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static bool evaluate( T1 const& lhs, T2 const& rhs) {
            return opCast( lhs ) ==  opCast( rhs );
        }